

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

int c_strmatch(char *str,char *pattern)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  char *pattern_00;
  
  iVar3 = 0;
  if (pattern != (char *)0x0 && str != (char *)0x0) {
    while( true ) {
      pattern_00 = pattern + 1;
      cVar2 = *pattern;
      if (cVar2 == '*') break;
      if (cVar2 == '\0') {
        return (uint)(*str == '\0');
      }
      if (*str == '\0') {
        return 0;
      }
      if (cVar2 != '?' && *str != cVar2) {
        return 0;
      }
      str = str + 1;
      pattern = pattern_00;
    }
    if (*pattern_00 == '\0') {
LAB_00105536:
      iVar3 = 1;
    }
    else {
      cVar2 = *str;
      while (iVar3 = 0, cVar2 != '\0') {
        iVar3 = c_strmatch(str,pattern_00);
        if (iVar3 != 0) goto LAB_00105536;
        pcVar1 = str + 1;
        str = str + 1;
        cVar2 = *pcVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int c_strmatch(const char *str, const char *pattern)
{
    int ok;

    if (str == NULL || pattern == NULL) {
        return 0;
    }

    for (;;) {
        /* Check if pattern is done */
        if (*pattern == '\0') {
            /* If string is at the end, we're good */
            if (*str == '\0') {
                return 1;
            }

            return 0;
        }

        if (*pattern == '*') {
            /* Move on */
            pattern++;

            /* If we are at the end, everything is fine */
            if (*pattern == '\0') {
                return 1;
            }

            /* Try to match each position */
            for (; *str != '\0'; str++) {
                ok = c_strmatch(str, pattern);
                if (ok) {
                    return 1;
                }
            }

            /* No match */
            return 0;
        }

        /* If we are at the end, leave */
        if (*str == '\0') {
            return 0;
        }

        /* Check if we have a single wildcard or matching char */
        if (*pattern != '?' && *str != *pattern) {
            return 0;
        }

        /* Move string and pattern */
        str++;
        pattern++;
    }

    return 0;
}